

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void start_server(uv_loop_t *loop,uv_tcp_t *handle)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  uv_tcp_t *handle_00;
  uv_tcp_t *puVar5;
  sockaddr_in addr;
  undefined1 auStack_30 [16];
  uv_loop_t *puStack_20;
  undefined1 auStack_18 [16];
  
  puVar5 = (uv_tcp_t *)0x194b6a;
  puStack_20 = (uv_loop_t *)0x1717d7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_loop_t *)0x1717ea;
    puVar5 = (uv_tcp_t *)loop;
    iVar1 = uv_tcp_init(loop,&tcp_server);
    if (iVar1 != 0) goto LAB_0017182a;
    puVar5 = &tcp_server;
    puStack_20 = (uv_loop_t *)0x1717ff;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_18,0);
    if (iVar1 != 0) goto LAB_0017182f;
    puVar5 = &tcp_server;
    puStack_20 = (uv_loop_t *)0x17181b;
    iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x17182a;
    start_server_cold_1();
LAB_0017182a:
    puStack_20 = (uv_loop_t *)0x17182f;
    start_server_cold_2();
LAB_0017182f:
    puStack_20 = (uv_loop_t *)0x171834;
    start_server_cold_3();
  }
  puStack_20 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  handle_00 = (uv_tcp_t *)0x23a3;
  puStack_20 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_30);
  if (iVar1 == 0) {
    handle_00 = &tcp_client;
    iVar1 = uv_tcp_init(puVar5);
    if (iVar1 != 0) goto LAB_00171898;
    handle_00 = &tcp_client;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_30,connect_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    do_connect_cold_1();
LAB_00171898:
    do_connect_cold_2();
  }
  do_connect_cold_3();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 1;
  shutdown_before_close = 1;
  do_connect(::loop,handle_00);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171956;
    if (shutdown_cb_called != 0) goto LAB_0017195b;
    handle_00 = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop);
    if (iVar1 != 0) goto LAB_00171960;
    if (write_cb_called != 4) goto LAB_00171965;
    if (close_cb_called != 0) goto LAB_0017196a;
    if (shutdown_cb_called != 1) goto LAB_0017196f;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    handle_00 = (uv_tcp_t *)0x0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_00171956:
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_0017195b:
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_00171960:
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_00171965:
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_0017196a:
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_0017196f:
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(::loop,handle_00);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171a2d;
    if (shutdown_cb_called != 0) goto LAB_00171a32;
    handle_00 = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop);
    if (iVar1 != 0) goto LAB_00171a37;
    if (write_cb_called != 4) goto LAB_00171a3c;
    if (close_cb_called != 1) goto LAB_00171a41;
    if (shutdown_cb_called != 0) goto LAB_00171a46;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    handle_00 = (uv_tcp_t *)0x0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_00171a2d:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_00171a32:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_00171a37:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_00171a3c:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_00171a41:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_00171a46:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 0;
  shutdown_before_close = 1;
  puVar4 = ::loop;
  do_connect(::loop,handle_00);
  iVar1 = (int)handle_00;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171b04;
    if (shutdown_cb_called != 0) goto LAB_00171b09;
    iVar1 = 0;
    puVar4 = ::loop;
    iVar2 = uv_run(::loop);
    if (iVar2 != 0) goto LAB_00171b0e;
    if (write_cb_called != 4) goto LAB_00171b13;
    if (close_cb_called != 0) goto LAB_00171b18;
    if (shutdown_cb_called != 1) goto LAB_00171b1d;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar1 = 0;
    uv_run(uVar3);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_00171b04:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_00171b09:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_00171b0e:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_00171b13:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_00171b18:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_00171b1d:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(puVar4,&tcp_accepted);
      if (iVar1 == 0) {
        uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_00171b7e;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_00171b7e:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT(r == 0);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT(r == 0);
}